

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int json_emit_quoted_str(char *s,int s_len,char *str,int len)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char ch;
  char *str_end;
  char *end;
  char *begin;
  char *pcStack_20;
  int len_local;
  char *str_local;
  char *pcStack_10;
  int s_len_local;
  char *s_local;
  
  pcVar2 = s + s_len;
  if (s < pcVar2) {
    *s = '\"';
  }
  pcStack_10 = s + 1;
  pcStack_20 = str;
  while (pcStack_20 < str + len) {
    pcVar3 = pcStack_20 + 1;
    cVar1 = *pcStack_20;
    pcStack_20 = pcVar3;
    if (cVar1 == '\b') {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = '\\';
      }
      if (pcStack_10 + 1 < pcVar2) {
        pcStack_10[1] = 'b';
      }
      pcStack_10 = pcStack_10 + 2;
    }
    else if (cVar1 == '\t') {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = '\\';
      }
      if (pcStack_10 + 1 < pcVar2) {
        pcStack_10[1] = 't';
      }
      pcStack_10 = pcStack_10 + 2;
    }
    else if (cVar1 == '\n') {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = '\\';
      }
      if (pcStack_10 + 1 < pcVar2) {
        pcStack_10[1] = 'n';
      }
      pcStack_10 = pcStack_10 + 2;
    }
    else if (cVar1 == '\f') {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = '\\';
      }
      if (pcStack_10 + 1 < pcVar2) {
        pcStack_10[1] = 'f';
      }
      pcStack_10 = pcStack_10 + 2;
    }
    else if (cVar1 == '\r') {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = '\\';
      }
      if (pcStack_10 + 1 < pcVar2) {
        pcStack_10[1] = 'r';
      }
      pcStack_10 = pcStack_10 + 2;
    }
    else if (cVar1 == '\"') {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = '\\';
      }
      if (pcStack_10 + 1 < pcVar2) {
        pcStack_10[1] = '\"';
      }
      pcStack_10 = pcStack_10 + 2;
    }
    else if (cVar1 == '\\') {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = '\\';
      }
      if (pcStack_10 + 1 < pcVar2) {
        pcStack_10[1] = '\\';
      }
      pcStack_10 = pcStack_10 + 2;
    }
    else {
      if (pcStack_10 < pcVar2) {
        *pcStack_10 = cVar1;
      }
      pcStack_10 = pcStack_10 + 1;
    }
  }
  if (pcStack_10 < pcVar2) {
    *pcStack_10 = '\"';
  }
  pcStack_10 = pcStack_10 + 1;
  if (pcStack_10 < pcVar2) {
    *pcStack_10 = '\0';
  }
  return (int)pcStack_10 - (int)s;
}

Assistant:

int json_emit_quoted_str(char *s, int s_len, const char *str, int len) {
    const char *begin = s, *end = s + s_len, *str_end = str + len;
    char ch;

#define EMIT(x) do { if (s < end) *s = x; s++; } while (0)

    EMIT('"');
    while (str < str_end) {
        ch = *str++;
        switch (ch) {
            case '"':
                EMIT('\\');
                EMIT('"');
                break;
            case '\\':
                EMIT('\\');
                EMIT('\\');
                break;
            case '\b':
                EMIT('\\');
                EMIT('b');
                break;
            case '\f':
                EMIT('\\');
                EMIT('f');
                break;
            case '\n':
                EMIT('\\');
                EMIT('n');
                break;
            case '\r':
                EMIT('\\');
                EMIT('r');
                break;
            case '\t':
                EMIT('\\');
                EMIT('t');
                break;
            default:
                EMIT(ch);
        }
    }
    EMIT('"');
    if (s < end) {
        *s = '\0';
    }

    return s - begin;
}